

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZROT::LoadableGetStateBlock_x
          (ChContactTriangleXYZROT *this,int block_offset,ChState *mD)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  element_type *peVar4;
  long lVar5;
  Index index_5;
  Index index_4;
  Index index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (block_offset < 0) goto LAB_00629f7b;
  lVar5 = (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  lVar1 = lVar5 + -3;
  if (lVar1 < block_offset) goto LAB_00629f7b;
  pdVar3 = (mD->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  peVar4 = (this->mnode1).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar2 = pdVar3 + block_offset;
  uVar6 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00629d24;
  }
  else {
LAB_00629d24:
    uVar8 = 0;
    do {
      pdVar2[uVar8] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar2[uVar6] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  uVar6 = (ulong)(uint)block_offset;
  lVar5 = lVar5 + -4;
  if (lVar5 < (long)(uVar6 + 3)) goto LAB_00629f7b;
  pdVar2 = pdVar3 + uVar6 + 3;
  uVar8 = 4;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 4) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00629d97;
  }
  else {
LAB_00629d97:
    uVar9 = 0;
    do {
      pdVar2[uVar9] = *(double *)(&peVar4->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 4) {
    do {
      pdVar2[uVar8] = *(double *)(&peVar4->field_0x38 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
  }
  if (lVar1 < (long)(uVar6 + 7)) goto LAB_00629f7b;
  peVar4 = (this->mnode2).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar2 = pdVar3 + uVar6 + 7;
  uVar8 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00629e08;
  }
  else {
LAB_00629e08:
    uVar9 = 0;
    do {
      pdVar2[uVar9] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar2[uVar8] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 10)) goto LAB_00629f7b;
  pdVar2 = pdVar3 + uVar6 + 10;
  uVar8 = 4;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 4) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00629e75;
  }
  else {
LAB_00629e75:
    uVar9 = 0;
    do {
      pdVar2[uVar9] = *(double *)(&peVar4->field_0x38 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 4) {
    do {
      pdVar2[uVar8] = *(double *)(&peVar4->field_0x38 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 4);
  }
  if (lVar1 < (long)(uVar6 + 0xe)) goto LAB_00629f7b;
  peVar4 = (this->mnode3).
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar2 = pdVar3 + uVar6 + 0xe;
  uVar8 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar8 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00629ee6;
  }
  else {
LAB_00629ee6:
    uVar9 = 0;
    do {
      pdVar2[uVar9] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (uVar8 < 3) {
    do {
      pdVar2[uVar8] = *(double *)(&(peVar4->super_ChNodeFEAbase).field_0x20 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar8 != 3);
  }
  if (lVar5 < (long)(uVar6 + 0x11)) {
LAB_00629f7b:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar3 = pdVar3 + uVar6 + 0x11;
  uVar6 = 4;
  if (((ulong)pdVar3 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 4) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_00629f5f;
  }
  uVar8 = 0;
  do {
    pdVar3[uVar8] = *(double *)(&peVar4->field_0x38 + uVar8 * 8);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_00629f5f:
  if (uVar6 < 4) {
    do {
      pdVar3[uVar6] = *(double *)(&peVar4->field_0x38 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
  }
  return;
}

Assistant:

void ChContactTriangleXYZROT::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos().eigen();
    mD.segment(block_offset + 3, 4) = mnode1->GetRot().eigen();

    mD.segment(block_offset + 7, 3) = mnode2->GetPos().eigen();
    mD.segment(block_offset + 10, 4) = mnode2->GetRot().eigen();

    mD.segment(block_offset + 14, 3) = mnode3->GetPos().eigen();
    mD.segment(block_offset + 17, 4) = mnode3->GetRot().eigen();
}